

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O1

void __thiscall
mp::VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::apply_precision_options
          (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this,int sol_rnd,int sol_prec
          )

{
  int iVar1;
  double *pdVar2;
  double *x;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (sol_rnd < 100) {
    this->sol_rnd_ = sol_rnd;
    dVar4 = pow(10.0,(double)sol_rnd);
    pdVar3 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar2) {
      do {
        dVar5 = round(*pdVar3 * dVar4);
        *pdVar3 = dVar5 * (1.0 / dVar4);
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar2);
    }
  }
  if (sol_prec < 100) {
    this->sol_prec_ = sol_prec;
    pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar3 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
      dVar4 = *pdVar3;
      dVar5 = 0.0;
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        iVar1 = this->sol_prec_;
        dVar5 = log10(ABS(dVar4));
        dVar5 = ceil(dVar5);
        dVar6 = pow(10.0,(double)iVar1 - dVar5);
        dVar5 = round(dVar4 * dVar6);
        dVar5 = dVar5 / dVar6;
      }
      *pdVar3 = dVar5;
    }
  }
  return;
}

Assistant:

void apply_precision_options(
      int sol_rnd, int sol_prec) {
    try {                 // Apply sol_rnd
      if (sol_rnd<100) {
        sol_rnd_ = (sol_rnd);
        auto scale = std::pow(10, sol_rnd_);
        auto scale_rec = 1.0/scale;
        for (auto& x: x_)
          x = std::round(x * scale) * scale_rec;
      }
    } catch (...) { sol_rnd_=100; }     // Could add a warning
    try {                 // Apply sol_prec
      if (sol_prec<100) {
        sol_prec_ = (sol_prec);
        for (auto& x: x_)
          x = round_to_digits(x, sol_prec_);
      }
    } catch (...) { sol_prec_=100; }     // Could add a warning
  }